

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O0

void WebPRescalerExportRow(WebPRescaler *wrk)

{
  WebPRescaler *in_RDI;
  int i;
  int local_c;
  
  if (in_RDI->y_accum < 1) {
    if (in_RDI->y_expand == 0) {
      if (in_RDI->fxy_scale == 0) {
        for (local_c = 0; local_c < in_RDI->num_channels * in_RDI->dst_width; local_c = local_c + 1)
        {
          in_RDI->dst[local_c] = (uint8_t)in_RDI->irow[local_c];
          in_RDI->irow[local_c] = 0;
        }
      }
      else {
        (*WebPRescalerExportRowShrink)(in_RDI);
      }
    }
    else {
      (*WebPRescalerExportRowExpand)(in_RDI);
    }
    in_RDI->y_accum = in_RDI->y_add + in_RDI->y_accum;
    in_RDI->dst = in_RDI->dst + in_RDI->dst_stride;
    in_RDI->dst_y = in_RDI->dst_y + 1;
  }
  return;
}

Assistant:

void WebPRescalerExportRow(WebPRescaler* const wrk) {
  if (wrk->y_accum <= 0) {
    assert(!WebPRescalerOutputDone(wrk));
    if (wrk->y_expand) {
      WebPRescalerExportRowExpand(wrk);
    } else if (wrk->fxy_scale) {
      WebPRescalerExportRowShrink(wrk);
    } else {  // special case
      int i;
      assert(wrk->src_height == wrk->dst_height && wrk->x_add == 1);
      assert(wrk->src_width == 1 && wrk->dst_width <= 2);
      for (i = 0; i < wrk->num_channels * wrk->dst_width; ++i) {
        wrk->dst[i] = wrk->irow[i];
        wrk->irow[i] = 0;
      }
    }
    wrk->y_accum += wrk->y_add;
    wrk->dst += wrk->dst_stride;
    ++wrk->dst_y;
  }
}